

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.hpp
# Opt level: O2

void __thiscall TasGrid::GridSequence::loadGpuNodes<float>(GridSequence *this)

{
  uint new_stride;
  size_t __p;
  ulong uVar1;
  ulong uVar2;
  undefined4 *puVar3;
  CudaSequenceData<float> *pCVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  Data2D<int> transpoints;
  vector<int,_std::allocator<int>_> num_nodes;
  
  pCVar4 = (this->gpu_cachef)._M_t.
           super___uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::CudaSequenceData<float>_*,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
           .super__Head_base<0UL,_TasGrid::CudaSequenceData<float>_*,_false>._M_head_impl;
  if (pCVar4 == (CudaSequenceData<float> *)0x0) {
    Utils::make_unique<TasGrid::CudaSequenceData<float>>();
    __p = transpoints.stride;
    transpoints.stride = 0;
    std::
    __uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
    ::reset((__uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
             *)&this->gpu_cachef,(pointer)__p);
    ::std::
    unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
    ::~unique_ptr((unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                   *)&transpoints);
    pCVar4 = (this->gpu_cachef)._M_t.
             super___uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_TasGrid::CudaSequenceData<float>_*,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
             .super__Head_base<0UL,_TasGrid::CudaSequenceData<float>_*,_false>._M_head_impl;
  }
  if ((pCVar4->num_nodes).num_entries == 0) {
    GpuVector<float>::load<double>
              (&pCVar4->nodes,(this->super_BaseCanonicalGrid).acceleration,
               (vector<double,_std::allocator<double>_> *)&this->nodes);
    GpuVector<float>::load<double>
              (&((this->gpu_cachef)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaSequenceData<float>_*,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaSequenceData<float>_*,_false>._M_head_impl)->
                coeff,(this->super_BaseCanonicalGrid).acceleration,
               (vector<double,_std::allocator<double>_> *)&this->coeff);
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&num_nodes,
               (long)(this->super_BaseCanonicalGrid).num_dimensions,(allocator_type *)&transpoints);
    ::std::
    transform<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,TasGrid::GridSequence::loadGpuNodes<float>()const::_lambda(int)_1_>
              ((this->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
               num_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
    GpuVector<int>::load
              (&((this->gpu_cachef)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaSequenceData<float>_*,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaSequenceData<float>_*,_false>._M_head_impl)->
                num_nodes,(this->super_BaseCanonicalGrid).acceleration,
               (vector<int,_std::allocator<int>_> *)&num_nodes);
    lVar6 = 0x18;
    if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar6 = 0x40;
    }
    new_stride = *(uint *)((long)&(this->super_BaseCanonicalGrid).acceleration + lVar6);
    Data2D<int>::Data2D<int,int>
              (&transpoints,new_stride,(this->super_BaseCanonicalGrid).num_dimensions);
    uVar1 = 0;
    uVar7 = (ulong)new_stride;
    if ((int)new_stride < 1) {
      uVar7 = uVar1;
    }
    for (uVar2 = 0; uVar2 != uVar7; uVar2 = uVar2 + 1) {
      puVar3 = (undefined4 *)
               ((long)transpoints.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar1);
      for (lVar5 = 0; lVar5 < (this->super_BaseCanonicalGrid).num_dimensions; lVar5 = lVar5 + 1) {
        *puVar3 = *(undefined4 *)
                   (*(long *)((long)&(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid + lVar6
                             ) * uVar1 +
                    *(long *)((long)&(this->super_BaseCanonicalGrid).num_dimensions + lVar6) +
                   lVar5 * 4);
        puVar3 = puVar3 + transpoints.stride;
      }
      uVar1 = uVar1 + 4;
    }
    GpuVector<int>::load<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (&((this->gpu_cachef)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaSequenceData<float>_*,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaSequenceData<float>_*,_false>._M_head_impl)->
                points,(this->super_BaseCanonicalGrid).acceleration,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               transpoints.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               transpoints.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&transpoints.vec.super__Vector_base<int,_std::allocator<int>_>);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&num_nodes);
  }
  return;
}

Assistant:

void loadGpuNodes() const{
        auto& ccache = getGpuCache<T>();
        if (!ccache) ccache = Utils::make_unique<CudaSequenceData<T>>();
        if (!ccache->num_nodes.empty()) return;

        ccache->nodes.load(acceleration, nodes);
        ccache->coeff.load(acceleration, coeff);

        std::vector<int> num_nodes(num_dimensions);
        std::transform(max_levels.begin(), max_levels.end(), num_nodes.begin(), [](int i)->int{ return i+1; });
        ccache->num_nodes.load(acceleration, num_nodes);

        const MultiIndexSet *work = (points.empty()) ? &needed : &points;
        int num_points = work->getNumIndexes();
        Data2D<int> transpoints(work->getNumIndexes(), num_dimensions);
        for(int i=0; i<num_points; i++){
            for(int j=0; j<num_dimensions; j++){
                transpoints.getStrip(j)[i] = work->getIndex(i)[j];
            }
        }
        ccache->points.load(acceleration, transpoints.begin(), transpoints.end());
    }